

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

char * curl_mvaprintf(char *format,__va_list_tag *ap_save)

{
  char *local_48;
  asprintf info;
  int retcode;
  __va_list_tag *ap_save_local;
  char *format_local;
  
  local_48 = (char *)0x0;
  info.buffer = (char *)0x0;
  info.len = 0;
  info.alloc._0_4_ = 0;
  info._28_4_ = dprintf_formatf(&local_48,alloc_addbyter,format,ap_save);
  if ((info._28_4_ == -1) || ((int)info.alloc != 0)) {
    if (info.len != 0) {
      (*Curl_cfree)(local_48);
    }
    format_local = (char *)0x0;
  }
  else if (info.len == 0) {
    format_local = (*Curl_cstrdup)("");
  }
  else {
    local_48[(long)info.buffer] = '\0';
    format_local = local_48;
  }
  return format_local;
}

Assistant:

char *curl_mvaprintf(const char *format, va_list ap_save)
{
  int retcode;
  struct asprintf info;

  info.buffer = NULL;
  info.len = 0;
  info.alloc = 0;
  info.fail = 0;

  retcode = dprintf_formatf(&info, alloc_addbyter, format, ap_save);
  if((-1 == retcode) || info.fail) {
    if(info.alloc)
      free(info.buffer);
    return NULL;
  }

  if(info.alloc) {
    info.buffer[info.len] = 0; /* we terminate this with a zero byte */
    return info.buffer;
  }
  return strdup("");
}